

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O1

void __thiscall
duckdb::DatabaseInstance::Initialize
          (DatabaseInstance *this,char *database_path,DBConfig *user_config)

{
  unique_ptr<duckdb::TaskScheduler,_std::default_delete<duckdb::TaskScheduler>,_true> *this_00;
  string *db_type;
  _Head_base<0UL,_duckdb::DatabaseFileSystem_*,_false> _Var1;
  _Head_base<0UL,_duckdb::DatabaseManager_*,_false> this_01;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  StorageOptions options;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Head_base<0UL,_duckdb::DatabaseFileSystem_*,_false> _Var4;
  _Head_base<0UL,_duckdb::DatabaseManager_*,_false> this_03;
  element_type *peVar5;
  LogManager *this_04;
  ExternalFileCache *this_05;
  TaskScheduler *this_06;
  pointer __p;
  ConnectionManager *this_07;
  pointer this_08;
  type fs;
  pointer pDVar6;
  pointer this_09;
  type fs_00;
  pointer pTVar7;
  InternalException *this_10;
  DBConfig default_config;
  undefined1 local_789;
  shared_ptr<duckdb::LogManager> local_788;
  shared_ptr<duckdb::LogManager,_true> local_778;
  undefined1 local_768 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_750;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_740;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_708;
  DBConfig local_6c8;
  
  DBConfig::DBConfig(&local_6c8);
  if (user_config == (DBConfig *)0x0) {
    user_config = &local_6c8;
  }
  Configure(this,user_config,database_path);
  this->create_api_v1 = CreateAPIv1Wrapper;
  _Var4._M_head_impl = (DatabaseFileSystem *)operator_new(0x20);
  (_Var4._M_head_impl)->super_OpenerFileSystem = (OpenerFileSystem)&PTR__DatabaseFileSystem_02484b98
  ;
  (_Var4._M_head_impl)->db = this;
  ((_Var4._M_head_impl)->database_opener).super_FileOpener = (FileOpener)&PTR__FileOpener_02484d28;
  ((_Var4._M_head_impl)->database_opener).db = this;
  _Var1._M_head_impl =
       (this->db_file_system).
       super_unique_ptr<duckdb::DatabaseFileSystem,_std::default_delete<duckdb::DatabaseFileSystem>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::DatabaseFileSystem,_std::default_delete<duckdb::DatabaseFileSystem>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::DatabaseFileSystem_*,_std::default_delete<duckdb::DatabaseFileSystem>_>
       .super__Head_base<0UL,_duckdb::DatabaseFileSystem_*,_false>._M_head_impl;
  (this->db_file_system).
  super_unique_ptr<duckdb::DatabaseFileSystem,_std::default_delete<duckdb::DatabaseFileSystem>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::DatabaseFileSystem,_std::default_delete<duckdb::DatabaseFileSystem>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::DatabaseFileSystem_*,_std::default_delete<duckdb::DatabaseFileSystem>_>
  .super__Head_base<0UL,_duckdb::DatabaseFileSystem_*,_false>._M_head_impl = _Var4._M_head_impl;
  if (_Var1._M_head_impl != (DatabaseFileSystem *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_OpenerFileSystem + 8))();
  }
  this_03._M_head_impl = (DatabaseManager *)operator_new(0xa8);
  DatabaseManager::DatabaseManager(this_03._M_head_impl,this);
  this_01._M_head_impl =
       (this->db_manager).
       super_unique_ptr<duckdb::DatabaseManager,_std::default_delete<duckdb::DatabaseManager>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::DatabaseManager,_std::default_delete<duckdb::DatabaseManager>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::DatabaseManager_*,_std::default_delete<duckdb::DatabaseManager>_>
       .super__Head_base<0UL,_duckdb::DatabaseManager_*,_false>._M_head_impl;
  (this->db_manager).
  super_unique_ptr<duckdb::DatabaseManager,_std::default_delete<duckdb::DatabaseManager>_>._M_t.
  super___uniq_ptr_impl<duckdb::DatabaseManager,_std::default_delete<duckdb::DatabaseManager>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::DatabaseManager_*,_std::default_delete<duckdb::DatabaseManager>_>.
  super__Head_base<0UL,_duckdb::DatabaseManager_*,_false>._M_head_impl = this_03._M_head_impl;
  if (this_01._M_head_impl != (DatabaseManager *)0x0) {
    DatabaseManager::~DatabaseManager(this_01._M_head_impl);
    operator_delete(this_01._M_head_impl);
  }
  if ((this->config).buffer_manager.internal.
      super___shared_ptr<duckdb::BufferManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    peVar5 = (element_type *)operator_new(0x118);
    pcVar2 = (this->config).options.temporary_directory._M_dataplus._M_p;
    local_768._0_8_ = local_768 + 0x10;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_768,pcVar2,
               pcVar2 + (this->config).options.temporary_directory._M_string_length);
    StandardBufferManager::StandardBufferManager
              ((StandardBufferManager *)peVar5,this,(string *)local_768);
    local_788.super___shared_ptr<duckdb::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
    if ((undefined1 *)local_768._0_8_ != local_768 + 0x10) {
      operator_delete((void *)local_768._0_8_);
    }
    shared_ptr<duckdb::BufferManager,_true>::
    operator=<duckdb::StandardBufferManager,_std::default_delete<duckdb::StandardBufferManager>,_true,_0>
              (&this->buffer_manager,
               (unique_ptr<duckdb::StandardBufferManager,_std::default_delete<duckdb::StandardBufferManager>,_true>
                *)&local_788);
    if (local_788.super___shared_ptr<duckdb::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      (*(code *)((((local_788.super___shared_ptr<duckdb::LogManager,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_enable_shared_from_this<duckdb::LogManager>).__weak_this_.internal
                  .super___weak_ptr<duckdb::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::LogManager>).__weak_this_.internal.
                super___weak_ptr<duckdb::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                ();
    }
  }
  else {
    shared_ptr<duckdb::BufferManager,_true>::operator=
              (&this->buffer_manager,&(this->config).buffer_manager);
  }
  LogConfig::LogConfig((LogConfig *)local_768);
  local_788.super___shared_ptr<duckdb::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::LogManager,std::allocator<duckdb::LogManager>,duckdb::DatabaseInstance&,duckdb::LogConfig>
            (&local_788.super___shared_ptr<duckdb::LogManager,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(LogManager **)&local_788,(allocator<duckdb::LogManager> *)&local_789,this
             ,(LogConfig *)local_768);
  shared_ptr<duckdb::LogManager,_true>::shared_ptr(&local_778,&local_788);
  if (local_788.super___shared_ptr<duckdb::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_788.super___shared_ptr<duckdb::LogManager,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  _Var3._M_pi = local_778.internal.
                super___shared_ptr<duckdb::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  peVar5 = local_778.internal.super___shared_ptr<duckdb::LogManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_778.internal.super___shared_ptr<duckdb::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_778.internal.super___shared_ptr<duckdb::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_02 = (this->log_manager).internal.
            super___shared_ptr<duckdb::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->log_manager).internal.super___shared_ptr<duckdb::LogManager,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar5;
  (this->log_manager).internal.super___shared_ptr<duckdb::LogManager,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var3._M_pi;
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
  }
  if (local_778.internal.super___shared_ptr<duckdb::LogManager,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_778.internal.super___shared_ptr<duckdb::LogManager,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_708);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_740);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_768._12_4_,local_768._8_4_) != &aStack_750) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_768._12_4_,local_768._8_4_));
  }
  this_04 = shared_ptr<duckdb::LogManager,_true>::operator->(&this->log_manager);
  LogManager::Initialize(this_04);
  this_05 = (ExternalFileCache *)operator_new(0x70);
  ExternalFileCache::ExternalFileCache
            (this_05,this,(this->config).options.enable_external_file_cache);
  ::std::__uniq_ptr_impl<duckdb::ExternalFileCache,_std::default_delete<duckdb::ExternalFileCache>_>
  ::reset((__uniq_ptr_impl<duckdb::ExternalFileCache,_std::default_delete<duckdb::ExternalFileCache>_>
           *)&this->external_file_cache,this_05);
  this_06 = (TaskScheduler *)operator_new(0x80);
  TaskScheduler::TaskScheduler(this_06,this);
  this_00 = &this->scheduler;
  ::std::__uniq_ptr_impl<duckdb::TaskScheduler,_std::default_delete<duckdb::TaskScheduler>_>::reset
            ((__uniq_ptr_impl<duckdb::TaskScheduler,_std::default_delete<duckdb::TaskScheduler>_> *)
             this_00,this_06);
  __p = (pointer)operator_new(0x60);
  (__p->cache)._M_h._M_buckets = (__buckets_ptr)0x0;
  (__p->cache)._M_h._M_bucket_count = 0;
  (__p->cache)._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  *(undefined4 *)&(__p->cache)._M_h._M_rehash_policy.field_0x4 = 0;
  (__p->cache)._M_h._M_rehash_policy._M_next_resize = 0;
  *(undefined1 (*) [16])&(__p->cache)._M_h._M_single_bucket = (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)&(__p->lock).super___mutex_base._M_mutex + 8) = (undefined1  [16])0x0
  ;
  *(__pthread_internal_list **)((long)&(__p->lock).super___mutex_base._M_mutex + 0x18) =
       (__pthread_internal_list *)0x0;
  *(__pthread_internal_list **)((long)&(__p->lock).super___mutex_base._M_mutex + 0x20) =
       (__pthread_internal_list *)0x0;
  (__p->cache)._M_h._M_before_begin = (_Hash_node_base *)0x0;
  (__p->cache)._M_h._M_element_count = 0;
  (__p->cache)._M_h._M_buckets = &(__p->cache)._M_h._M_single_bucket;
  (__p->cache)._M_h._M_bucket_count = 1;
  (__p->cache)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])&(__p->cache)._M_h._M_rehash_policy._M_next_resize = (undefined1  [16])0x0;
  *(undefined1 (*) [16])&(__p->lock).super___mutex_base._M_mutex = (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)&(__p->lock).super___mutex_base._M_mutex + 0x10) =
       (undefined1  [16])0x0;
  (__p->lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  ::std::__uniq_ptr_impl<duckdb::ObjectCache,_std::default_delete<duckdb::ObjectCache>_>::reset
            ((__uniq_ptr_impl<duckdb::ObjectCache,_std::default_delete<duckdb::ObjectCache>_> *)
             &this->object_cache,__p);
  this_07 = (ConnectionManager *)operator_new(0x70);
  ConnectionManager::ConnectionManager(this_07);
  ::std::__uniq_ptr_impl<duckdb::ConnectionManager,_std::default_delete<duckdb::ConnectionManager>_>
  ::reset((__uniq_ptr_impl<duckdb::ConnectionManager,_std::default_delete<duckdb::ConnectionManager>_>
           *)&this->connection_manager,this_07);
  this_08 = unique_ptr<duckdb::SecretManager,_std::default_delete<duckdb::SecretManager>,_true>::
            operator->(&(this->config).secret_manager);
  SecretManager::Initialize(this_08,this);
  fs = unique_ptr<duckdb::DatabaseFileSystem,_std::default_delete<duckdb::DatabaseFileSystem>,_true>
       ::operator*(&this->db_file_system);
  db_type = &(this->config).options.database_type;
  DBPathAndType::ResolveDatabaseType((FileSystem *)fs,&(this->config).options.database_path,db_type)
  ;
  pDVar6 = unique_ptr<duckdb::DatabaseManager,_std::default_delete<duckdb::DatabaseManager>,_true>::
           operator->(&this->db_manager);
  this_09 = unique_ptr<duckdb::AttachedDatabase,_std::default_delete<duckdb::AttachedDatabase>,_true>
            ::operator->(&pDVar6->system);
  local_768._0_8_ = (pointer)0xffffffffffffffff;
  local_768._8_4_ = 0xffffffff;
  local_768._12_4_ = 0xffffffff;
  local_768._16_4_ = 0xffffffff;
  local_768._20_4_ = 0xffffffff;
  aStack_750._0_4_ = 0xffffffff;
  aStack_750._4_4_ = 0xffffffff;
  aStack_750._8_8_ = 0;
  options.row_group_size.index = 0xffffffffffffffff;
  options.block_alloc_size.index = 0xffffffffffffffff;
  options.storage_version.index = 0xffffffffffffffff;
  options.block_header_size.index = 0xffffffffffffffff;
  options._32_8_ = 0;
  AttachedDatabase::Initialize(this_09,(optional_ptr<duckdb::ClientContext,_true>)0x0,options);
  if ((this->config).options.database_type._M_string_length != 0) {
    if ((this->config).file_system.
        super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
        super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>.
        super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl == (FileSystem *)0x0) {
      this_10 = (InternalException *)__cxa_allocate_exception(0x10);
      local_768._0_8_ = local_768 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_768,"No file system!?","");
      InternalException::InternalException(this_10,(string *)local_768);
      __cxa_throw(this_10,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    fs_00 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::operator*
                      (&(this->config).file_system);
    ExtensionHelper::LoadExternalExtension(this,fs_00,db_type);
  }
  LoadExtensionSettings(this);
  pDVar6 = unique_ptr<duckdb::DatabaseManager,_std::default_delete<duckdb::DatabaseManager>,_true>::
           operator->(&this->db_manager);
  if ((pDVar6->default_database)._M_string_length == 0) {
    CreateMainDatabase(this);
  }
  pTVar7 = unique_ptr<duckdb::TaskScheduler,_std::default_delete<duckdb::TaskScheduler>,_true>::
           operator->(this_00);
  TaskScheduler::SetThreads
            (pTVar7,(this->config).options.maximum_threads,(this->config).options.external_threads);
  pTVar7 = unique_ptr<duckdb::TaskScheduler,_std::default_delete<duckdb::TaskScheduler>,_true>::
           operator->(this_00);
  TaskScheduler::RelaunchThreads(pTVar7);
  DBConfig::~DBConfig(&local_6c8);
  return;
}

Assistant:

void DatabaseInstance::Initialize(const char *database_path, DBConfig *user_config) {
	DBConfig default_config;
	DBConfig *config_ptr = &default_config;
	if (user_config) {
		config_ptr = user_config;
	}

	Configure(*config_ptr, database_path);

	create_api_v1 = CreateAPIv1Wrapper;

	db_file_system = make_uniq<DatabaseFileSystem>(*this);
	db_manager = make_uniq<DatabaseManager>(*this);
	if (config.buffer_manager) {
		buffer_manager = config.buffer_manager;
	} else {
		buffer_manager = make_uniq<StandardBufferManager>(*this, config.options.temporary_directory);
	}

	log_manager = make_shared_ptr<LogManager>(*this, LogConfig());
	log_manager->Initialize();

	external_file_cache = make_uniq<ExternalFileCache>(*this, config.options.enable_external_file_cache);

	scheduler = make_uniq<TaskScheduler>(*this);
	object_cache = make_uniq<ObjectCache>();
	connection_manager = make_uniq<ConnectionManager>();

	// initialize the secret manager
	config.secret_manager->Initialize(*this);

	// resolve the type of teh database we are opening
	auto &fs = FileSystem::GetFileSystem(*this);
	DBPathAndType::ResolveDatabaseType(fs, config.options.database_path, config.options.database_type);

	// initialize the system catalog
	db_manager->InitializeSystemCatalog();

	if (!config.options.database_type.empty()) {
		// if we are opening an extension database - load the extension
		if (!config.file_system) {
			throw InternalException("No file system!?");
		}
		ExtensionHelper::LoadExternalExtension(*this, *config.file_system, config.options.database_type);
	}

	LoadExtensionSettings();

	if (!db_manager->HasDefaultDatabase()) {
		CreateMainDatabase();
	}

	// only increase thread count after storage init because we get races on catalog otherwise
	scheduler->SetThreads(config.options.maximum_threads, config.options.external_threads);
	scheduler->RelaunchThreads();
}